

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_Test::
~TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_Test
          (TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_Test *this)

{
  TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_Test *this_local;
  
  ~TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithAmpersandsAndLessThan)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("&object1 < &object2", "importantFile", 999)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"importantFile:999: &amp;object1 &lt; &amp;object2\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}